

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O0

bool __thiscall
lzham::lzcompressor::state::advance
          (state *this,CLZBase *lzbase,search_accelerator *dict,lzdecision *lzdec)

{
  adaptive_bit_model *paVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  lzdecision *in_RCX;
  CLZBase *in_RSI;
  state *in_RDI;
  uint num_extra_bits;
  uint main_sym;
  uint match_high_sym;
  int large_len_sym;
  uint match_low_sym;
  uint match_extra;
  uint match_slot;
  int dist_1;
  int dist;
  int match_hist_index;
  uint delta_lit;
  uint rep_lit0;
  uint lit;
  uint is_match_model_index;
  uint in_stack_ffffffffffffff8c;
  int iVar5;
  int local_54;
  uint local_4c;
  uint local_48;
  undefined4 local_44;
  undefined4 local_40;
  int local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  lzdecision *local_28;
  CLZBase *local_18;
  
  local_2c = (in_RDI->super_state_base).m_cur_state;
  uVar4 = (ulong)local_2c;
  paVar1 = in_RDI->m_is_match_model;
  local_28 = in_RCX;
  local_18 = in_RSI;
  bVar2 = lzdecision::is_match(in_RCX);
  adaptive_bit_model::update(paVar1 + uVar4,(uint)bVar2);
  bVar2 = lzdecision::is_match(local_28);
  if (bVar2) {
    if (local_28->m_dist < 0) {
      adaptive_bit_model::update(in_RDI->m_is_rep_model + (in_RDI->super_state_base).m_cur_state,1);
      local_3c = -1 - local_28->m_dist;
      if (local_3c == 0) {
        adaptive_bit_model::update
                  (in_RDI->m_is_rep0_model + (in_RDI->super_state_base).m_cur_state,1);
        if (local_28->m_len == 1) {
          adaptive_bit_model::update
                    (in_RDI->m_is_rep0_single_byte_model + (in_RDI->super_state_base).m_cur_state,1)
          ;
          uVar3 = 0xb;
          if ((in_RDI->super_state_base).m_cur_state < 7) {
            uVar3 = 9;
          }
          (in_RDI->super_state_base).m_cur_state = uVar3;
        }
        else {
          adaptive_bit_model::update
                    (in_RDI->m_is_rep0_single_byte_model + (in_RDI->super_state_base).m_cur_state,0)
          ;
          if (local_28->m_len < 0x102) {
            uVar4 = lzham::quasi_adaptive_huffman_data_model::update_sym
                              ((int)in_RDI + 0x268 +
                               (uint)(6 < (in_RDI->super_state_base).m_cur_state) * 0x90);
            if ((uVar4 & 1) == 0) {
              return false;
            }
          }
          else {
            uVar4 = lzham::quasi_adaptive_huffman_data_model::update_sym
                              ((int)in_RDI + 0x268 +
                               (uint)(6 < (in_RDI->super_state_base).m_cur_state) * 0x90);
            if ((uVar4 & 1) == 0) {
              return false;
            }
          }
          uVar3 = 0xb;
          if ((in_RDI->super_state_base).m_cur_state < 7) {
            uVar3 = 8;
          }
          (in_RDI->super_state_base).m_cur_state = uVar3;
        }
      }
      else {
        adaptive_bit_model::update
                  (in_RDI->m_is_rep0_model + (in_RDI->super_state_base).m_cur_state,0);
        if (local_28->m_len < 0x102) {
          uVar4 = lzham::quasi_adaptive_huffman_data_model::update_sym
                            ((int)in_RDI + 0x268 +
                             (uint)(6 < (in_RDI->super_state_base).m_cur_state) * 0x90);
          if ((uVar4 & 1) == 0) {
            return false;
          }
        }
        else {
          uVar4 = lzham::quasi_adaptive_huffman_data_model::update_sym
                            ((int)in_RDI + 0x268 +
                             (uint)(6 < (in_RDI->super_state_base).m_cur_state) * 0x90);
          if ((uVar4 & 1) == 0) {
            return false;
          }
        }
        if (local_3c == 1) {
          adaptive_bit_model::update
                    (in_RDI->m_is_rep1_model + (in_RDI->super_state_base).m_cur_state,1);
          std::swap<unsigned_int>
                    ((in_RDI->super_state_base).m_match_hist,
                     (uint *)((long)(in_RDI->super_state_base).m_match_hist + 4));
        }
        else {
          adaptive_bit_model::update
                    (in_RDI->m_is_rep1_model + (in_RDI->super_state_base).m_cur_state,0);
          if (local_3c == 2) {
            adaptive_bit_model::update
                      (in_RDI->m_is_rep2_model + (in_RDI->super_state_base).m_cur_state,1);
            local_40 = *(undefined4 *)((long)(in_RDI->super_state_base).m_match_hist + 8);
            *(undefined4 *)((long)(in_RDI->super_state_base).m_match_hist + 8) =
                 *(undefined4 *)((long)(in_RDI->super_state_base).m_match_hist + 4);
            *(uint *)((long)(in_RDI->super_state_base).m_match_hist + 4) =
                 (in_RDI->super_state_base).m_match_hist[0];
            (in_RDI->super_state_base).m_match_hist[0] = local_40;
          }
          else {
            adaptive_bit_model::update
                      (in_RDI->m_is_rep2_model + (in_RDI->super_state_base).m_cur_state,0);
            local_44 = *(undefined4 *)((long)(in_RDI->super_state_base).m_match_hist + 0xc);
            *(undefined4 *)((long)(in_RDI->super_state_base).m_match_hist + 0xc) =
                 *(undefined4 *)((long)(in_RDI->super_state_base).m_match_hist + 8);
            *(undefined4 *)((long)(in_RDI->super_state_base).m_match_hist + 8) =
                 *(undefined4 *)((long)(in_RDI->super_state_base).m_match_hist + 4);
            *(uint *)((long)(in_RDI->super_state_base).m_match_hist + 4) =
                 (in_RDI->super_state_base).m_match_hist[0];
            (in_RDI->super_state_base).m_match_hist[0] = local_44;
          }
        }
        uVar3 = 0xb;
        if ((in_RDI->super_state_base).m_cur_state < 7) {
          uVar3 = 8;
        }
        (in_RDI->super_state_base).m_cur_state = uVar3;
      }
    }
    else {
      adaptive_bit_model::update(in_RDI->m_is_rep_model + (in_RDI->super_state_base).m_cur_state,0);
      CLZBase::compute_lzx_position_slot(local_18,local_28->m_dist,&local_48,&local_4c);
      local_54 = -1;
      if (8 < local_28->m_len) {
        local_54 = local_28->m_len + -9;
      }
      uVar4 = lzham::quasi_adaptive_huffman_data_model::update_sym((int)in_RDI + 0x1d8);
      if ((uVar4 & 1) == 0) {
        return false;
      }
      if (-1 < local_54) {
        if (local_28->m_len < 0x102) {
          uVar4 = lzham::quasi_adaptive_huffman_data_model::update_sym
                            ((int)in_RDI + 0x388 +
                             (uint)(6 < (in_RDI->super_state_base).m_cur_state) * 0x90);
          if ((uVar4 & 1) == 0) {
            return false;
          }
        }
        else {
          uVar4 = lzham::quasi_adaptive_huffman_data_model::update_sym
                            ((int)in_RDI + 0x388 +
                             (uint)(6 < (in_RDI->super_state_base).m_cur_state) * 0x90);
          if ((uVar4 & 1) == 0) {
            return false;
          }
        }
      }
      if ((2 < *(byte *)((long)&CLZDecompBase::m_lzx_position_extra_bits + (ulong)local_48)) &&
         (uVar4 = lzham::quasi_adaptive_huffman_data_model::update_sym((int)in_RDI + 0x4a8),
         (uVar4 & 1) == 0)) {
        return false;
      }
      update_match_hist(in_RDI,local_28->m_dist);
      uVar3 = 10;
      if ((in_RDI->super_state_base).m_cur_state < 7) {
        uVar3 = 7;
      }
      (in_RDI->super_state_base).m_cur_state = uVar3;
    }
  }
  else {
    local_30 = search_accelerator::operator[]
                         ((search_accelerator *)in_RDI,in_stack_ffffffffffffff8c);
    if ((in_RDI->super_state_base).m_cur_state < 7) {
      uVar4 = lzham::quasi_adaptive_huffman_data_model::update_sym((int)in_RDI + 0xb8);
      if ((uVar4 & 1) == 0) {
        return false;
      }
    }
    else {
      local_34 = search_accelerator::operator[]
                           ((search_accelerator *)in_RDI,in_stack_ffffffffffffff8c);
      local_38 = local_34 ^ local_30;
      uVar4 = lzham::quasi_adaptive_huffman_data_model::update_sym((int)in_RDI + 0x148);
      if ((uVar4 & 1) == 0) {
        return false;
      }
    }
    if ((in_RDI->super_state_base).m_cur_state < 4) {
      (in_RDI->super_state_base).m_cur_state = 0;
    }
    else if ((in_RDI->super_state_base).m_cur_state < 10) {
      (in_RDI->super_state_base).m_cur_state = (in_RDI->super_state_base).m_cur_state - 3;
    }
    else {
      (in_RDI->super_state_base).m_cur_state = (in_RDI->super_state_base).m_cur_state - 6;
    }
  }
  iVar5 = local_28->m_pos;
  uVar3 = lzdecision::get_len((lzdecision *)0x118b54);
  (in_RDI->super_state_base).m_cur_ofs = iVar5 + uVar3;
  return true;
}

Assistant:

bool lzcompressor::state::advance(CLZBase& lzbase, const search_accelerator& dict, const lzdecision& lzdec)
   {
      //const uint lit_pred0 = get_pred_char(dict, lzdec.m_pos, 1);

      uint is_match_model_index = LZHAM_IS_MATCH_MODEL_INDEX(m_cur_state);
      m_is_match_model[is_match_model_index].update(lzdec.is_match());

      if (!lzdec.is_match())
      {
         const uint lit = dict[lzdec.m_pos];

         if (m_cur_state < CLZBase::cNumLitStates)
         {
            // literal
            if (!m_lit_table.update_sym(lit)) 
            {
               LZHAM_LOG_ERROR(8008);
               return false;
            }
         }
         else
         {
            // delta literal
            const uint rep_lit0 = dict[(lzdec.m_pos - m_match_hist[0]) & dict.m_max_dict_size_mask];
            
            uint delta_lit = rep_lit0 ^ lit;
				            
            if (!m_delta_lit_table.update_sym(delta_lit)) 
            {
               LZHAM_LOG_ERROR(8009);
               return false;
            }
         }

         if (m_cur_state < 4) m_cur_state = 0; else if (m_cur_state < 10) m_cur_state -= 3; else m_cur_state -= 6;
      }
      else
      {
         // match
         if (lzdec.m_dist < 0)
         {
            // rep match
            m_is_rep_model[m_cur_state].update(1);

            int match_hist_index = -lzdec.m_dist - 1;

            if (!match_hist_index)
            {
               // rep0 match
               m_is_rep0_model[m_cur_state].update(1);

               if (lzdec.m_len == 1)
               {
                  // single byte rep0
                  m_is_rep0_single_byte_model[m_cur_state].update(1);

                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 9 : 11;
               }
               else
               {
                  // normal rep0
                  m_is_rep0_single_byte_model[m_cur_state].update(0);

                  if (lzdec.m_len > CLZBase::cMaxMatchLen)
                  {
                     if (!m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].update_sym((CLZBase::cMaxMatchLen + 1) - CLZBase::cMinMatchLen)) 
                     {
                        LZHAM_LOG_ERROR(8010);
                        return false;
                     }
                  }
                  else
                  {
                     if (!m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].update_sym(lzdec.m_len - CLZBase::cMinMatchLen)) 
                     {
                        LZHAM_LOG_ERROR(8011);
                        return false;
                     }
                  }

                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
               }
            }
            else
            {
               // rep1-rep3 match
               m_is_rep0_model[m_cur_state].update(0);

               if (lzdec.m_len > CLZBase::cMaxMatchLen)
               {
                  if (!m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].update_sym((CLZBase::cMaxMatchLen + 1) - CLZBase::cMinMatchLen)) 
                  {
                     LZHAM_LOG_ERROR(8012);
                     return false;
                  }
               }
               else
               {
                  if (!m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].update_sym(lzdec.m_len - CLZBase::cMinMatchLen)) 
                  {
                     LZHAM_LOG_ERROR(8013);
                     return false;
                  }
               }

               if (match_hist_index == 1)
               {
                  // rep1
                  m_is_rep1_model[m_cur_state].update(1);

                  std::swap(m_match_hist[0], m_match_hist[1]);
               }
               else
               {
                  m_is_rep1_model[m_cur_state].update(0);

                  if (match_hist_index == 2)
                  {
                     // rep2
                     m_is_rep2_model[m_cur_state].update(1);

                     int dist = m_match_hist[2];
                     m_match_hist[2] = m_match_hist[1];
                     m_match_hist[1] = m_match_hist[0];
                     m_match_hist[0] = dist;
                  }
                  else
                  {
                     // rep3
                     m_is_rep2_model[m_cur_state].update(0);

                     int dist = m_match_hist[3];
                     m_match_hist[3] = m_match_hist[2];
                     m_match_hist[2] = m_match_hist[1];
                     m_match_hist[1] = m_match_hist[0];
                     m_match_hist[0] = dist;
                  }
               }

               m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
            }
         }
         else
         {
            m_is_rep_model[m_cur_state].update(0);

            LZHAM_ASSERT(lzdec.m_len >= CLZBase::cMinMatchLen);

            // full match
            uint match_slot, match_extra;
            lzbase.compute_lzx_position_slot(lzdec.m_dist, match_slot, match_extra);

            uint match_low_sym = 0;
            int large_len_sym = -1;
            if (lzdec.m_len >= 9)
            {
               match_low_sym = 7;

               large_len_sym = lzdec.m_len - 9;
            }
            else
               match_low_sym = lzdec.m_len - 2;

            uint match_high_sym = 0;

            LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
            match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

            uint main_sym = match_low_sym | (match_high_sym << 3);

            if (!m_main_table.update_sym(CLZBase::cLZXNumSpecialLengths + main_sym)) 
            {
               LZHAM_LOG_ERROR(8014);
               return false;
            }

            if (large_len_sym >= 0)
            {
               if (lzdec.m_len > CLZBase::cMaxMatchLen)
               {
                  if (!m_large_len_table[m_cur_state >= CLZBase::cNumLitStates].update_sym((CLZBase::cMaxMatchLen + 1) - 9)) 
                  {
                     LZHAM_LOG_ERROR(8015);
                     return false;
                  }
               }
               else
               {
                  if (!m_large_len_table[m_cur_state >= CLZBase::cNumLitStates].update_sym(large_len_sym)) 
                  {
                     LZHAM_LOG_ERROR(8016);
                     return false;
                  }
               }
            }

            uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
            if (num_extra_bits >= 3)
            {
               if (!m_dist_lsb_table.update_sym(match_extra & 15)) 
               {
                  LZHAM_LOG_ERROR(8017);
                  return false;
               }
            }

            update_match_hist(lzdec.m_dist);

            m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? CLZBase::cNumLitStates : CLZBase::cNumLitStates + 3;
         }
      }

      m_cur_ofs = lzdec.m_pos + lzdec.get_len();
      return true;
   }